

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O2

void test_chain_boundary_insertion<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true>>>
               (Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>
                *m1,Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>
                    *m2)

{
  pointer pIVar1;
  undefined1 *puVar2;
  Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>
  *m;
  bool bVar3;
  uint cellID;
  anon_class_1_0_00000001 test;
  char *local_358;
  char *local_350;
  Index local_348 [2];
  undefined8 local_340;
  shared_count sStack_338;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
  *local_330;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  undefined **local_310;
  undefined1 local_308;
  undefined8 *local_300;
  char **local_2f8;
  Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>
  *local_2f0;
  value_type boundary1;
  value_type boundary2;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_2b8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_2a0;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  char *local_58;
  char *local_50;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_2f0 = m2;
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true>>>>
            ();
  cellID = 0;
  while( true ) {
    if ((ulong)(((long)orderedBoundaries.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)orderedBoundaries.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= (ulong)cellID) break;
    Gudhi::persistence_matrix::
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true>>>
    ::insert_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
               (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true>>>
                *)&m1->matrix_,cellID,
               orderedBoundaries.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + cellID,-1);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
    cellID = cellID + 1;
  }
  local_58 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_50 = "";
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_58,0x220);
  m = local_2f0;
  local_308 = 0;
  local_310 = &PTR__lazy_ostream_001fe138;
  local_300 = &boost::unit_test::lazy_ostream::inst;
  local_2f8 = (char **)0x19e294;
  local_78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_70 = "";
  boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = (m1->matrix_).nextIndex_;
  boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 7;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_310,&local_78,0x220,1,2,&boundary2,"m1.get_number_of_columns()",&boundary1,"7");
  test_chain_boundary_insertion<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
  ::anon_class_1_0_00000001::operator()(&test,m1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&boundary2,
             orderedBoundaries.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1);
  orderedBoundaries.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       orderedBoundaries.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish + -1;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(orderedBoundaries.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&boundary1,
             orderedBoundaries.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1);
  orderedBoundaries.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       orderedBoundaries.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish + -1;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(orderedBoundaries.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_80 = "";
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_88,0x228);
  local_330 = &m->matrix_;
  bVar3 = Gudhi::persistence_matrix::
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
          ::is_zero_entry(local_330,1,2);
  local_340 = 0;
  sStack_338.pi_ = (sp_counted_base *)0x0;
  local_358 = "m2.is_zero_entry(1, 2)";
  local_350 = "";
  local_308 = 0;
  local_310 = &PTR__lazy_ostream_001fe278;
  local_300 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_a0 = "";
  local_2f8 = &local_358;
  local_348[0]._0_1_ = bVar3;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_338);
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b8,0x229);
  bVar3 = Gudhi::persistence_matrix::
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
          ::is_zero_entry(local_330,1,1);
  local_348[0]._0_1_ = !bVar3;
  local_340 = 0;
  sStack_338.pi_ = (sp_counted_base *)0x0;
  local_358 = "!m2.is_zero_entry(1, 1)";
  local_350 = "";
  local_308 = 0;
  local_310 = &PTR__lazy_ostream_001fe278;
  local_300 = &boost::unit_test::lazy_ostream::inst;
  local_d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_d0 = "";
  local_2f8 = &local_358;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_338);
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8,0x22a);
  bVar3 = Gudhi::persistence_matrix::
          Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
          ::is_zero_entry(local_330,3,3);
  local_348[0]._0_1_ = !bVar3;
  local_340 = 0;
  sStack_338.pi_ = (sp_counted_base *)0x0;
  local_358 = "!m2.is_zero_entry(3, 3)";
  local_350 = "";
  local_308 = 0;
  local_310 = &PTR__lazy_ostream_001fe278;
  local_300 = &boost::unit_test::lazy_ostream::inst;
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_100 = "";
  local_2f8 = &local_358;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_338);
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_118,0x22b);
  pIVar1 = (m->matrix_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(undefined1 **)&(pIVar1->column_).super_type.data_.root_plus_size_;
  local_348[0]._0_1_ = (Column_support *)puVar2 != &pIVar1->column_ && puVar2 != (undefined1 *)0x0;
  local_340 = 0;
  sStack_338.pi_ = (sp_counted_base *)0x0;
  local_358 = "!m2.is_zero_column(0)";
  local_350 = "";
  local_308 = 0;
  local_310 = &PTR__lazy_ostream_001fe278;
  local_300 = &boost::unit_test::lazy_ostream::inst;
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_130 = "";
  local_2f8 = &local_358;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_338);
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_148,0x22c);
  pIVar1 = (m->matrix_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(undefined1 **)&pIVar1[1].column_.super_type.data_.root_plus_size_;
  local_348[0]._0_1_ = (Column_support *)puVar2 != &pIVar1[1].column_ && puVar2 != (undefined1 *)0x0
  ;
  local_340 = 0;
  sStack_338.pi_ = (sp_counted_base *)0x0;
  local_358 = "!m2.is_zero_column(1)";
  local_350 = "";
  local_308 = 0;
  local_310 = &PTR__lazy_ostream_001fe278;
  local_300 = &boost::unit_test::lazy_ostream::inst;
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_160 = "";
  local_2f8 = &local_358;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_338);
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_170 = "";
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_178,0x22d);
  pIVar1 = (m->matrix_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(undefined1 **)&pIVar1[2].column_.super_type.data_.root_plus_size_;
  local_348[0]._0_1_ = (Column_support *)puVar2 != &pIVar1[2].column_ && puVar2 != (undefined1 *)0x0
  ;
  local_340 = 0;
  sStack_338.pi_ = (sp_counted_base *)0x0;
  local_358 = "!m2.is_zero_column(2)";
  local_350 = "";
  local_308 = 0;
  local_310 = &PTR__lazy_ostream_001fe278;
  local_300 = &boost::unit_test::lazy_ostream::inst;
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_190 = "";
  local_2f8 = &local_358;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_338);
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1a0 = "";
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a8,0x22e);
  pIVar1 = (m->matrix_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(undefined1 **)&pIVar1[3].column_.super_type.data_.root_plus_size_;
  local_348[0]._0_1_ = (Column_support *)puVar2 != &pIVar1[3].column_ && puVar2 != (undefined1 *)0x0
  ;
  local_340 = 0;
  sStack_338.pi_ = (sp_counted_base *)0x0;
  local_358 = "!m2.is_zero_column(3)";
  local_350 = "";
  local_308 = 0;
  local_310 = &PTR__lazy_ostream_001fe278;
  local_300 = &boost::unit_test::lazy_ostream::inst;
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1c0 = "";
  local_2f8 = &local_358;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_338);
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8,0x22f);
  pIVar1 = (m->matrix_).matrix_.
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(undefined1 **)&pIVar1[4].column_.super_type.data_.root_plus_size_;
  local_348[0] = CONCAT31(local_348[0]._1_3_,
                          (Column_support *)puVar2 != &pIVar1[4].column_ &&
                          puVar2 != (undefined1 *)0x0);
  local_340 = 0;
  sStack_338.pi_ = (sp_counted_base *)0x0;
  local_358 = "!m2.is_zero_column(4)";
  local_350 = "";
  local_308 = 0;
  local_310 = &PTR__lazy_ostream_001fe278;
  local_300 = &boost::unit_test::lazy_ostream::inst;
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f0 = "";
  local_2f8 = &local_358;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_338);
  local_208 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_200 = "";
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_208,0x231);
  local_308 = 0;
  local_310 = &PTR__lazy_ostream_001fe138;
  local_300 = &boost::unit_test::lazy_ostream::inst;
  local_2f8 = (char **)0x19e294;
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_220 = "";
  local_348[0] = (m->matrix_).nextIndex_;
  local_358._0_4_ = 5;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_310,&local_228,0x231,1,2,local_348,"m2.get_number_of_columns()",&local_358,"5");
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true>>>
  ::insert_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2a0,
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true>>>
              *)local_330,&boundary1,-1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_2a0);
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_238,0x233);
  local_308 = 0;
  local_310 = &PTR__lazy_ostream_001fe138;
  local_300 = &boost::unit_test::lazy_ostream::inst;
  local_2f8 = (char **)0x19e294;
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_250 = "";
  local_348[0] = (m->matrix_).nextIndex_;
  local_358._0_4_ = 6;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_310,&local_258,0x233,1,2,local_348,"m2.get_number_of_columns()",&local_358,"6");
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true>>>
  ::insert_boundary<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2b8,
             (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true>>>
              *)local_330,&boundary2,-1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_2b8);
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_268,0x235);
  local_308 = 0;
  local_310 = &PTR__lazy_ostream_001fe138;
  local_300 = &boost::unit_test::lazy_ostream::inst;
  local_2f8 = (char **)0x19e294;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_280 = "";
  local_348[0] = (m->matrix_).nextIndex_;
  local_358 = (char *)CONCAT44(local_358._4_4_,7);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_310,&local_288,0x235,1,2,local_348,"m2.get_number_of_columns()",&local_358,"7");
  test_chain_boundary_insertion<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true>_>_>
  ::anon_class_1_0_00000001::operator()(&test,m);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&boundary1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&boundary2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&orderedBoundaries);
  return;
}

Assistant:

void test_chain_boundary_insertion(Matrix& m1, Matrix& m2) {
  auto test = [](Matrix& m) {
    BOOST_CHECK(m.is_zero_entry(1, 2));
    BOOST_CHECK(!m.is_zero_entry(1, 1));
    BOOST_CHECK(!m.is_zero_entry(3, 3));
    BOOST_CHECK(!m.is_zero_column(0));
    BOOST_CHECK(!m.is_zero_column(1));
    BOOST_CHECK(!m.is_zero_column(2));
    BOOST_CHECK(!m.is_zero_column(3));
    BOOST_CHECK(!m.is_zero_column(4));
    BOOST_CHECK(!m.is_zero_column(5));
    BOOST_CHECK(!m.is_zero_column(6));

    BOOST_CHECK_EQUAL(m.get_column_dimension(0), 0);
    BOOST_CHECK_EQUAL(m.get_column_dimension(1), 0);
    BOOST_CHECK_EQUAL(m.get_column_dimension(2), 0);
    BOOST_CHECK_EQUAL(m.get_column_dimension(3), 1);
    BOOST_CHECK_EQUAL(m.get_column_dimension(4), 1);
    BOOST_CHECK_EQUAL(m.get_column_dimension(5), 1);
    BOOST_CHECK_EQUAL(m.get_column_dimension(6), 2);

    BOOST_CHECK_EQUAL(m.get_pivot(0), 0);
    BOOST_CHECK_EQUAL(m.get_pivot(1), 1);
    BOOST_CHECK_EQUAL(m.get_pivot(2), 2);
    BOOST_CHECK_EQUAL(m.get_pivot(3), 3);
    BOOST_CHECK_EQUAL(m.get_pivot(4), 4);
    BOOST_CHECK_EQUAL(m.get_pivot(5), 5);
    BOOST_CHECK_EQUAL(m.get_pivot(6), 6);

    BOOST_CHECK_EQUAL(m.get_column_with_pivot(0), 0);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(1), 1);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(2), 2);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(3), 3);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(4), 4);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(5), 5);
    BOOST_CHECK_EQUAL(m.get_column_with_pivot(6), 6);
  };

  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  for (unsigned int i = 0; i < orderedBoundaries.size(); ++i) {
    if constexpr (is_indexed_by_position<Matrix>())
      m1.insert_boundary(orderedBoundaries[i]);
    else
      m1.insert_boundary(i, orderedBoundaries[i]);
  }
  BOOST_CHECK_EQUAL(m1.get_number_of_columns(), 7);
  test(m1);

  auto boundary2 = orderedBoundaries.back();
  orderedBoundaries.pop_back();
  auto boundary1 = orderedBoundaries.back();
  orderedBoundaries.pop_back();

  BOOST_CHECK(m2.is_zero_entry(1, 2));
  BOOST_CHECK(!m2.is_zero_entry(1, 1));
  BOOST_CHECK(!m2.is_zero_entry(3, 3));
  BOOST_CHECK(!m2.is_zero_column(0));
  BOOST_CHECK(!m2.is_zero_column(1));
  BOOST_CHECK(!m2.is_zero_column(2));
  BOOST_CHECK(!m2.is_zero_column(3));
  BOOST_CHECK(!m2.is_zero_column(4));

  BOOST_CHECK_EQUAL(m2.get_number_of_columns(), 5);
  m2.insert_boundary(boundary1);
  BOOST_CHECK_EQUAL(m2.get_number_of_columns(), 6);
  m2.insert_boundary(boundary2);
  BOOST_CHECK_EQUAL(m2.get_number_of_columns(), 7);
  test(m2);
}